

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

aiNode * __thiscall Assimp::B3DImporter::ReadNODE(B3DImporter *this,aiNode *parent)

{
  pointer *this_00;
  pointer *this_01;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *this_02;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> uVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  __uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true> this_03;
  aiNodeAnim *this_04;
  pointer paVar5;
  uint *puVar6;
  aiNode **ppaVar7;
  aiQuaternion aVar8;
  aiVector3D aVar9;
  aiNode *local_2b0;
  aiNode *child;
  uint i;
  uint n;
  string t_1;
  vector<aiNode_*,_std::allocator<aiNode_*>_> children;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> nodeAnim;
  aiNode *node;
  int nodeid;
  undefined1 local_1fc [8];
  aiMatrix4x4 tform;
  undefined1 local_198 [64];
  undefined1 auStack_158 [8];
  aiMatrix4x4 rot;
  aiMatrix4x4 scale;
  aiMatrix4x4 trans;
  aiQuaternion r;
  undefined1 local_78 [8];
  aiVector3D s;
  undefined1 local_48 [8];
  aiVector3D t;
  string name;
  aiNode *parent_local;
  B3DImporter *this_local;
  
  ReadString_abi_cxx11_((string *)&t.z,this);
  aVar9 = ReadVec3(this);
  t.x = aVar9.z;
  unique0x10000210 = aVar9._0_8_;
  local_48 = (undefined1  [8])unique0x10000210;
  aVar9 = ReadVec3(this);
  s.x = aVar9.z;
  local_78 = aVar9._0_8_;
  aVar8 = ReadQuat(this);
  trans._56_8_ = aVar8._0_8_;
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&scale.d3);
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&rot.d3);
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)auStack_158);
  aiMatrix4x4t<float>::Translation((aiVector3t<float> *)local_48,(aiMatrix4x4t<float> *)&scale.d3);
  aiMatrix4x4t<float>::Scaling((aiVector3t<float> *)local_78,(aiMatrix4x4t<float> *)&rot.d3);
  aiQuaterniont<float>::GetMatrix
            ((aiMatrix3x3t<float> *)&tform.d3,(aiQuaterniont<float> *)&trans.d3);
  aiMatrix4x4t<float>::aiMatrix4x4t
            ((aiMatrix4x4t<float> *)local_198,(aiMatrix3x3t<float> *)&tform.d3);
  rot.c3 = (float)local_198._48_4_;
  rot.c4 = (float)local_198._52_4_;
  rot.d1 = (float)local_198._56_4_;
  rot.d2 = (float)local_198._60_4_;
  rot.b3 = (float)local_198._32_4_;
  rot.b4 = (float)local_198._36_4_;
  rot.c1 = (float)local_198._40_4_;
  rot.c2 = (float)local_198._44_4_;
  rot.a3 = (float)local_198._16_4_;
  rot.a4 = (float)local_198._20_4_;
  rot.b1 = (float)local_198._24_4_;
  rot.b2 = (float)local_198._28_4_;
  auStack_158 = (undefined1  [8])local_198._0_8_;
  rot.a1 = (float)local_198._8_4_;
  rot.a2 = (float)local_198._12_4_;
  aiMatrix4x4t<float>::operator*
            ((aiMatrix4x4t<float> *)((long)&node + 4),(aiMatrix4x4t<float> *)&scale.d3,
             (aiMatrix4x4t<float> *)auStack_158);
  aiMatrix4x4t<float>::operator*
            ((aiMatrix4x4t<float> *)local_1fc,(aiMatrix4x4t<float> *)((long)&node + 4),
             (aiMatrix4x4t<float> *)&rot.d3);
  sVar4 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size(&this->_nodes);
  node._0_4_ = (int)sVar4;
  this_03.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)operator_new(0x478);
  aiNode::aiNode((aiNode *)
                 this_03.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                 super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                 super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,(string *)&t.z);
  nodeAnim._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       this_03.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
       super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
       super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&this->_nodes,(value_type *)&nodeAnim)
  ;
  *(aiNode **)
   ((long)nodeAnim._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x448) = parent;
  memcpy((void *)((long)nodeAnim._M_t.
                        super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                        super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                        super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404),local_1fc,
         0x40);
  std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>::
  unique_ptr<std::default_delete<aiNodeAnim>,void>
            ((unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>> *)
             &meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)((long)&t_1.field_2 + 8));
  while (uVar3 = ChunkSize(this), uVar3 != 0) {
    ReadChunk_abi_cxx11_((string *)&i,this);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                            "MESH");
    if (bVar2) {
      sVar4 = std::
              vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
              ::size(&this->_meshes);
      child._4_4_ = (uint)sVar4;
      ReadMESH(this);
      for (child._0_4_ = child._4_4_; uVar3 = (uint)child,
          sVar4 = std::
                  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                  ::size(&this->_meshes), uVar3 < (uint)sVar4; child._0_4_ = (uint)child + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(value_type_conflict1 *)&child);
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &i,"BONE");
      if (bVar2) {
        ReadBONE(this,(int)node);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&i,"ANIM");
        if (bVar2) {
          ReadANIM(this);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&i,"KEYS");
          if (bVar2) {
            bVar2 = std::unique_ptr::operator_cast_to_bool
                              ((unique_ptr *)
                               &meshes.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (!bVar2) {
              this_04 = (aiNodeAnim *)operator_new(0x438);
              aiNodeAnim::aiNodeAnim(this_04);
              this_00 = &meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
              std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::reset
                        ((unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *)this_00,this_04
                        );
              uVar1 = nodeAnim;
              paVar5 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->
                                 ((unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *)
                                  this_00);
              aiString::operator=(&paVar5->mNodeName,
                                  (aiString *)
                                  uVar1._M_t.
                                  super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                                  .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl);
            }
            paVar5 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::get
                               ((unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *)
                                &meshes.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            ReadKEYS(this,paVar5);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&i,"NODE");
            if (bVar2) {
              local_2b0 = ReadNODE(this,(aiNode *)
                                        nodeAnim._M_t.
                                        super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                                        .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl);
              std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                        ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)((long)&t_1.field_2 + 8),
                         &local_2b0);
            }
          }
        }
      }
    }
    ExitChunk(this);
    std::__cxx11::string::~string((string *)&i);
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)
                     &meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    std::
    vector<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>,std::allocator<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>>
    ::emplace_back<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>
              ((vector<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>,std::allocator<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>>
                *)&this->_nodeAnims,
               (unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *)
               &meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  this_01 = &children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  *(int *)((long)nodeAnim._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                 _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                 super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x460) = (int)sVar4;
  puVar6 = to_array<unsigned_int>
                     (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  *(uint **)((long)nodeAnim._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>
                   ._M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                   super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x468) = puVar6;
  this_02 = (vector<aiNode_*,_std::allocator<aiNode_*>_> *)((long)&t_1.field_2 + 8);
  sVar4 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size(this_02);
  *(int *)((long)nodeAnim._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                 _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                 super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x450) = (int)sVar4;
  ppaVar7 = to_array<aiNode*>(this,this_02);
  uVar1 = nodeAnim;
  *(aiNode ***)
   ((long)nodeAnim._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x458) = ppaVar7;
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)((long)&t_1.field_2 + 8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr
            ((unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *)
             &meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&t.z);
  return (aiNode *)
         (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)
         uVar1._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
         super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
         super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
}

Assistant:

aiNode *B3DImporter::ReadNODE( aiNode *parent ){

    string name=ReadString();
    aiVector3D t=ReadVec3();
    aiVector3D s=ReadVec3();
    aiQuaternion r=ReadQuat();

    aiMatrix4x4 trans,scale,rot;

    aiMatrix4x4::Translation( t,trans );
    aiMatrix4x4::Scaling( s,scale );
    rot=aiMatrix4x4( r.GetMatrix() );

    aiMatrix4x4 tform=trans * rot * scale;

    int nodeid=static_cast<int>(_nodes.size());

    aiNode *node=new aiNode( name );
    _nodes.push_back( node );

    node->mParent=parent;
    node->mTransformation=tform;

    std::unique_ptr<aiNodeAnim> nodeAnim;
    vector<unsigned> meshes;
    vector<aiNode*> children;

    while( ChunkSize() ){
        string t=ReadChunk();
        if( t=="MESH" ){
            unsigned int n= static_cast<unsigned int>(_meshes.size());
            ReadMESH();
            for( unsigned int i=n;i<static_cast<unsigned int>(_meshes.size());++i ){
                meshes.push_back( i );
            }
        }else if( t=="BONE" ){
            ReadBONE( nodeid );
        }else if( t=="ANIM" ){
            ReadANIM();
        }else if( t=="KEYS" ){
            if( !nodeAnim ){
                nodeAnim.reset(new aiNodeAnim);
                nodeAnim->mNodeName=node->mName;
            }
            ReadKEYS( nodeAnim.get() );
        }else if( t=="NODE" ){
            aiNode *child=ReadNODE( node );
            children.push_back( child );
        }
        ExitChunk();
    }

    if (nodeAnim) {
        _nodeAnims.emplace_back( std::move(nodeAnim) );
    }

    node->mNumMeshes= static_cast<unsigned int>(meshes.size());
    node->mMeshes=to_array( meshes );

    node->mNumChildren=static_cast<unsigned int>(children.size());
    node->mChildren=to_array( children );

    return node;
}